

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

MeshAttributeIndicesEncodingData * __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
GetAttributeEncodingData
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          int att_id)

{
  pointer pAVar1;
  pointer pAVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  pAVar2 = (this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->attribute_data_).
                super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2;
  bVar7 = lVar5 != 0;
  if (bVar7) {
    if (*(int *)&(((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    *)&pAVar2->attribute_index)->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start != att_id) {
      uVar3 = (lVar5 >> 4) * -0x79435e50d79435e5;
      uVar4 = 1;
      do {
        uVar6 = (ulong)uVar4;
        bVar8 = uVar3 - uVar6 == 0;
        bVar7 = uVar3 >= uVar6 && !bVar8;
        if (uVar3 < uVar6 || bVar8) goto LAB_0013cf06;
        uVar4 = uVar4 + 1;
      } while (pAVar2[uVar6].attribute_index != att_id);
      pAVar2 = pAVar2 + uVar6;
    }
    pAVar2 = (pointer)&pAVar2->encoding_data;
  }
LAB_0013cf06:
  pAVar1 = (pointer)&this->pos_encoding_data_;
  if (bVar7) {
    pAVar1 = pAVar2;
  }
  return (MeshAttributeIndicesEncodingData *)pAVar1;
}

Assistant:

const MeshAttributeIndicesEncodingData *
MeshEdgebreakerEncoderImpl<TraversalEncoder>::GetAttributeEncodingData(
    int att_id) const {
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    if (attribute_data_[i].attribute_index == att_id) {
      return &attribute_data_[i].encoding_data;
    }
  }
  return &pos_encoding_data_;
}